

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_ALG_SYM_OBJECT_Unmarshal
                 (TPMI_ALG_SYM_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_ALG_SYM_OBJECT TVar1;
  int iVar2;
  UINT16 UVar3;
  TPM_RC TVar4;
  
  iVar2 = *size;
  *size = iVar2 + -2;
  TVar4 = 0x9a;
  if (1 < iVar2) {
    UVar3 = ByteArrayToUint16(*buffer);
    *target = UVar3;
    *buffer = *buffer + 2;
    TVar1 = *target;
    if (((TVar1 == 3) || (TVar1 == 6)) || ((TVar4 = 0x96, TVar1 == 0x10 && (flag != 0)))) {
      TVar4 = 0;
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPMI_ALG_SYM_OBJECT_Unmarshal(TPMI_ALG_SYM_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_TDES
        case TPM_ALG_TDES:
#endif // ALG_TDES
#if         ALG_AES
        case TPM_ALG_AES:
#endif // ALG_AES
#if         ALG_SM4
        case TPM_ALG_SM4:
#endif // ALG_SM4
#if         ALG_CAMELLIA
        case TPM_ALG_CAMELLIA:
#endif // ALG_CAMELLIA
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_SYMMETRIC;
        default:
            return TPM_RC_SYMMETRIC;
    }
    return TPM_RC_SUCCESS;
}